

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShaders.hpp
# Opt level: O1

void __thiscall rr::FragmentShader::~FragmentShader(FragmentShader *this)

{
  pointer pFVar1;
  pointer pVVar2;
  
  this->_vptr_FragmentShader = (_func_int **)&PTR___cxa_pure_virtual_00b58d88;
  pFVar1 = (this->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pFVar1 != (pointer)0x0) {
    operator_delete(pFVar1,(long)(this->m_outputs).
                                 super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar1);
  }
  pVVar2 = (this->m_inputs).
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->m_inputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
    return;
  }
  return;
}

Assistant:

~FragmentShader		(void) {}